

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::Combo(char *label,int *current_item,char *items_separated_by_zeros,int height_in_items)

{
  bool bVar1;
  size_t sVar2;
  int items_count;
  char *__s;
  
  items_count = 0;
  for (__s = items_separated_by_zeros; *__s != '\0'; __s = __s + sVar2 + 1) {
    sVar2 = strlen(__s);
    items_count = items_count + 1;
  }
  bVar1 = Combo(label,current_item,Items_SingleStringGetter,items_separated_by_zeros,items_count,
                height_in_items);
  return bVar1;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* items_separated_by_zeros, int height_in_items)
{
    int items_count = 0;
    const char* p = items_separated_by_zeros;       // FIXME-OPT: Avoid computing this, or at least only when combo is open
    while (*p)
    {
        p += strlen(p) + 1;
        items_count++;
    }
    bool value_changed = Combo(label, current_item, Items_SingleStringGetter, (void*)items_separated_by_zeros, items_count, height_in_items);
    return value_changed;
}